

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128x2.cc
# Opt level: O1

int aead_aegis_128x2_open_gather
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,
              size_t in_len,uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int line;
  ulong uVar7;
  longlong local_280 [35];
  ulong local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  uint8_t local_d0 [16];
  undefined1 local_c0 [144];
  
  if (nonce_len < 0x11) {
    if (ctx->tag_len == in_tag_len) {
      local_168 = (ulong)ctx->tag_len;
      aegis_128x2_state_init((ctx->state).opaque,nonce,nonce_len,(aes_block_t_conflict *)local_280);
      if (0x3f < ad_len) {
        halt_baddata();
      }
      uVar7 = ad_len & 0x3f;
      if (uVar7 != 0) {
        memset(local_c0 + uVar7,0,0x40 - uVar7);
        memcpy(local_c0,ad,uVar7);
      }
      if (0x3f < in_len) {
        auVar2._8_8_ = local_280[5];
        auVar2._0_8_ = local_280[4];
        auVar2._16_8_ = local_280[6];
        auVar2._24_8_ = local_280[7];
        auVar1._8_8_ = local_280[9];
        auVar1._0_8_ = local_280[8];
        auVar1._16_8_ = local_280[10];
        auVar1._24_8_ = local_280[0xb];
        auVar3._8_8_ = local_280[0xd];
        auVar3._0_8_ = local_280[0xc];
        auVar3._16_8_ = local_280[0xe];
        auVar3._24_8_ = local_280[0xf];
        auVar4._8_8_ = local_280[0x19];
        auVar4._0_8_ = local_280[0x18];
        auVar4._16_8_ = local_280[0x1a];
        auVar4._24_8_ = local_280[0x1b];
        auVar5._8_8_ = local_280[0x1d];
        auVar5._0_8_ = local_280[0x1c];
        auVar5._16_8_ = local_280[0x1e];
        auVar5._24_8_ = local_280[0x1f];
        auVar1 = vpand_avx2(auVar1,auVar3);
        vpand_avx2(auVar4,auVar5);
        *(undefined1 (*) [32])out = auVar1 ^ *(undefined1 (*) [32])in ^ auVar2 ^ auVar4;
        halt_baddata();
      }
      uVar7 = in_len & 0x3f;
      if (uVar7 != 0) {
        memset((void *)((long)&local_160 + uVar7),0,0x40 - uVar7);
        memcpy(&local_160,in,uVar7);
      }
      aead_aegis_128x2_tag(local_d0,ad_len,in_len,(aes_block_t_conflict *)local_280);
      local_280[0x1c] = 0;
      local_280[0x1d] = 0;
      local_280[0x1e] = 0;
      local_280[0x1f] = 0;
      local_280[0x18] = 0;
      local_280[0x19] = 0;
      local_280[0x1a] = 0;
      local_280[0x1b] = 0;
      local_280[0x14] = 0;
      local_280[0x15] = 0;
      local_280[0x16] = 0;
      local_280[0x17] = 0;
      local_280[0x10] = 0;
      local_280[0x11] = 0;
      local_280[0x12] = 0;
      local_280[0x13] = 0;
      local_280[0xc] = 0;
      local_280[0xd] = 0;
      local_280[0xe] = 0;
      local_280[0xf] = 0;
      local_280[8] = 0;
      local_280[9] = 0;
      local_280[10] = 0;
      local_280[0xb] = 0;
      local_280[4] = 0;
      local_280[5] = 0;
      local_280[6] = 0;
      local_280[7] = 0;
      local_280[0] = 0;
      local_280[1] = 0;
      local_280[2] = 0;
      local_280[3] = 0;
      local_160 = 0;
      uStack_158 = 0;
      uStack_150 = 0;
      uStack_148 = 0;
      local_140 = 0;
      uStack_138 = 0;
      uStack_130 = 0;
      uStack_128 = 0;
      iVar6 = CRYPTO_memcmp(local_d0,in_tag,local_168);
      if (iVar6 == 0) {
        return 1;
      }
      iVar6 = 0x65;
      line = 0x198;
    }
    else {
      iVar6 = 0x65;
      line = 0x178;
    }
  }
  else {
    iVar6 = 0x79;
    line = 0x174;
  }
  ERR_put_error(0x1e,0,iVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis128x2.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_aegis_128x2_open_gather(const EVP_AEAD_CTX *ctx, uint8_t *out,
                                        const uint8_t *nonce, size_t nonce_len,
                                        const uint8_t *in, size_t in_len,
                                        const uint8_t *in_tag,
                                        size_t in_tag_len, const uint8_t *ad,
                                        size_t ad_len) {
  const struct aead_aegis_128x2_ctx *aegis_ctx =
      (struct aead_aegis_128x2_ctx *)&ctx->state;

  return aegis_128x2_open_gather(aegis_ctx->key, out, nonce, nonce_len, in,
                                 in_len, in_tag, in_tag_len, ad, ad_len,
                                 ctx->tag_len);
}